

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O2

void my_numbox_label_font(t_my_numbox *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  uint uVar2;
  t_float tVar3;
  
  tVar3 = atom_getfloatarg(1,ac,av);
  iVar1 = 4;
  if (4 < (int)tVar3) {
    iVar1 = (int)tVar3;
  }
  (x->x_gui).x_fontsize = iVar1;
  tVar3 = atom_getfloatarg(0,ac,av);
  uVar2 = (int)tVar3 & 0x3f;
  if (2 < (uint)(int)tVar3) {
    uVar2 = 0;
  }
  (x->x_gui).x_fsf = (t_iem_fstyle_flags)((uint)(x->x_gui).x_fsf & 0xffffffc0 | uVar2);
  my_numbox_calc_fontwidth(x);
  iemgui_label_font(x,&x->x_gui,s,ac,av);
  return;
}

Assistant:

static void my_numbox_label_font(t_my_numbox *x,
    t_symbol *s, int ac, t_atom *av)
{
    int f = (int)atom_getfloatarg(1, ac, av);

    if(f < 4)
        f = 4;
    x->x_gui.x_fontsize = f;
    f = (int)atom_getfloatarg(0, ac, av);
    if((f < 0) || (f > 2))
        f = 0;
    x->x_gui.x_fsf.x_font_style = f;
    my_numbox_calc_fontwidth(x);
    iemgui_label_font((void *)x, &x->x_gui, s, ac, av);
}